

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

CTypeID crec_bit64_type(CTState *cts,cTValue *tv)

{
  uint *in_RSI;
  CTState *in_RDI;
  CType *ct;
  CType *local_50;
  CTypeID local_34;
  
  if (in_RSI[1] == 0xfffffff5) {
    local_50 = lj_ctype_rawref(in_RDI,(uint)*(ushort *)((ulong)*in_RSI + 6));
    if (local_50->info >> 0x1c == 5) {
      local_50 = in_RDI->tab + (local_50->info & 0xffff);
    }
    if (((local_50->info & 0xfc800000) == 0x800000) && (local_50->size == 8)) {
      local_34 = 0xc;
    }
    else {
      local_34 = 0xb;
    }
  }
  else {
    local_34 = 0;
  }
  return local_34;
}

Assistant:

static CTypeID crec_bit64_type(CTState *cts, cTValue *tv)
{
  if (tviscdata(tv)) {
    CType *ct = lj_ctype_rawref(cts, cdataV(tv)->ctypeid);
    if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
    if ((ct->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && ct->size == 8)
      return CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    return CTID_INT64;  /* Otherwise use int64_t. */
  }
  return 0;  /* Use regular 32 bit ops. */
}